

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

int __thiscall
chrono::ChSystemDescriptor::BuildBiVector(ChSystemDescriptor *this,ChVectorDynamic<> *Bvector)

{
  Scalar SVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  ChConstraint *pCVar4;
  int iVar5;
  Scalar *pSVar6;
  size_t ic;
  long lVar7;
  
  iVar5 = (*this->_vptr_ChSystemDescriptor[8])();
  this->n_c = iVar5;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar5);
  ppCVar2 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar3 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (lVar7 = 0; (long)ppCVar2 - (long)ppCVar3 >> 3 != lVar7; lVar7 = lVar7 + 1) {
    pCVar4 = (this->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar7];
    if (pCVar4->active == true) {
      SVar1 = pCVar4->b_i;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Bvector,
                          (long)pCVar4->offset);
      *pSVar6 = SVar1;
    }
  }
  return this->n_c;
}

Assistant:

int ChSystemDescriptor::BuildBiVector(ChVectorDynamic<>& Bvector) {
    n_c = CountActiveConstraints();
    Bvector.setZero(n_c);

    auto vc_size = vconstraints.size();

    // Fill the 'b' vector
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            Bvector(vconstraints[ic]->GetOffset()) = vconstraints[ic]->Get_b_i();
        }
    }

    return n_c;
}